

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# brotli_bit_stream.c
# Opt level: O0

void BrotliStoreMetaBlock
               (MemoryManager *m,uint8_t *input,size_t start_pos,size_t length,size_t mask,
               uint8_t prev_byte,uint8_t prev_byte2,int is_last,uint32_t num_direct_distance_codes,
               uint32_t distance_postfix_bits,ContextType literal_context_mode,Command *commands,
               size_t n_commands,MetaBlockSplit *mb,size_t *storage_ix,uint8_t *storage)

{
  byte bVar1;
  ulong uVar2;
  undefined8 uVar3;
  uint uVar4;
  uint uVar5;
  int iVar6;
  HuffmanTree *tree_00;
  Command *pCVar7;
  ulong uVar8;
  size_t context_1;
  uint64_t distextra;
  uint32_t distnumextra;
  size_t dist_code;
  uint8_t literal;
  size_t context;
  size_t j_1;
  size_t j;
  size_t cmd_code;
  Command cmd;
  BlockEncoder distance_enc;
  BlockEncoder command_enc;
  BlockEncoder literal_enc;
  HuffmanTree *tree;
  size_t num_distance_codes;
  size_t i;
  size_t pos;
  uint8_t prev_byte_local;
  size_t mask_local;
  size_t length_local;
  size_t start_pos_local;
  uint8_t *input_local;
  MemoryManager *m_local;
  uint64_t v_4;
  uint8_t *p_4;
  uint64_t v_2;
  uint8_t *p_2;
  uint64_t v_1;
  uint8_t *p_1;
  uint64_t v;
  uint8_t *p;
  uint64_t bits;
  uint64_t copyextraval;
  uint64_t insextraval;
  uint32_t insnumextra;
  uint16_t copycode;
  uint16_t inscode;
  uint32_t copylen_code;
  uint64_t v_3;
  uint8_t *p_3;
  byte local_e1;
  uint32_t c;
  uint32_t r;
  uint local_bc;
  uint32_t nbits;
  ushort local_4a;
  uint32_t nbits_1;
  ushort local_22;
  
  StoreCompressedMetaBlockHeader(is_last,length,storage_ix,storage);
  tree_00 = (HuffmanTree *)BrotliAllocate(m,0x2c08);
  InitBlockEncoder((BlockEncoder *)&command_enc.bits_,0x100,(mb->literal_split).num_types,
                   (mb->literal_split).types,(mb->literal_split).lengths,
                   (mb->literal_split).num_blocks);
  InitBlockEncoder((BlockEncoder *)&distance_enc.bits_,0x2c0,(mb->command_split).num_types,
                   (mb->command_split).types,(mb->command_split).lengths,
                   (mb->command_split).num_blocks);
  InitBlockEncoder((BlockEncoder *)&cmd.dist_extra_,
                   (ulong)(num_direct_distance_codes + 0x10 +
                          (0x30 << ((byte)distance_postfix_bits & 0x1f))),
                   (mb->distance_split).num_types,(mb->distance_split).types,
                   (mb->distance_split).lengths,(mb->distance_split).num_blocks);
  BuildAndStoreBlockSwitchEntropyCodes
            ((BlockEncoder *)&command_enc.bits_,tree_00,storage_ix,storage);
  BuildAndStoreBlockSwitchEntropyCodes
            ((BlockEncoder *)&distance_enc.bits_,tree_00,storage_ix,storage);
  BuildAndStoreBlockSwitchEntropyCodes((BlockEncoder *)&cmd.dist_extra_,tree_00,storage_ix,storage);
  if (distance_postfix_bits >> 2 != 0) {
    __assert_fail("(bits >> n_bits) == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/brezza92[P]brotli/enc/././write_bits.h"
                  ,0x36,
                  "void BrotliWriteBits(size_t, uint64_t, size_t *restrict, uint8_t *restrict)");
  }
  *(ulong *)(storage + (*storage_ix >> 3)) =
       (ulong)distance_postfix_bits << ((byte)*storage_ix & 7) |
       (ulong)(byte)*(ulong *)(storage + (*storage_ix >> 3));
  *storage_ix = *storage_ix + 2;
  uVar4 = num_direct_distance_codes >> ((byte)distance_postfix_bits & 0x1f);
  if (uVar4 >> 4 != 0) {
    __assert_fail("(bits >> n_bits) == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/brezza92[P]brotli/enc/././write_bits.h"
                  ,0x36,
                  "void BrotliWriteBits(size_t, uint64_t, size_t *restrict, uint8_t *restrict)");
  }
  *(ulong *)(storage + (*storage_ix >> 3)) =
       (ulong)uVar4 << ((byte)*storage_ix & 7) |
       (ulong)(byte)*(ulong *)(storage + (*storage_ix >> 3));
  *storage_ix = *storage_ix + 4;
  for (num_distance_codes = 0; num_distance_codes < (mb->literal_split).num_types;
      num_distance_codes = num_distance_codes + 1) {
    if (literal_context_mode >> 2 != 0) {
      __assert_fail("(bits >> n_bits) == 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/brezza92[P]brotli/enc/././write_bits.h"
                    ,0x36,
                    "void BrotliWriteBits(size_t, uint64_t, size_t *restrict, uint8_t *restrict)");
    }
    *(ulong *)(storage + (*storage_ix >> 3)) =
         (ulong)literal_context_mode << ((byte)*storage_ix & 7) |
         (ulong)(byte)*(ulong *)(storage + (*storage_ix >> 3));
    *storage_ix = *storage_ix + 2;
  }
  if (mb->literal_context_map_size == 0) {
    StoreTrivialContextMap(mb->literal_histograms_size,6,tree_00,storage_ix,storage);
  }
  else {
    EncodeContextMap(m,mb->literal_context_map,mb->literal_context_map_size,
                     mb->literal_histograms_size,tree_00,storage_ix,storage);
  }
  if (mb->distance_context_map_size == 0) {
    StoreTrivialContextMap(mb->distance_histograms_size,2,tree_00,storage_ix,storage);
  }
  else {
    EncodeContextMap(m,mb->distance_context_map,mb->distance_context_map_size,
                     mb->distance_histograms_size,tree_00,storage_ix,storage);
  }
  BuildAndStoreEntropyCodesLiteral
            (m,(BlockEncoder *)&command_enc.bits_,mb->literal_histograms,mb->literal_histograms_size
             ,tree_00,storage_ix,storage);
  BuildAndStoreEntropyCodesCommand
            (m,(BlockEncoder *)&distance_enc.bits_,mb->command_histograms,
             mb->command_histograms_size,tree_00,storage_ix,storage);
  BuildAndStoreEntropyCodesDistance
            (m,(BlockEncoder *)&cmd.dist_extra_,mb->distance_histograms,mb->distance_histograms_size
             ,tree_00,storage_ix,storage);
  BrotliFree(m,tree_00);
  num_distance_codes = 0;
  i = start_pos;
  pos._7_1_ = prev_byte;
  while( true ) {
    if (n_commands <= num_distance_codes) {
      CleanupBlockEncoder(m,(BlockEncoder *)&cmd.dist_extra_);
      CleanupBlockEncoder(m,(BlockEncoder *)&distance_enc.bits_);
      CleanupBlockEncoder(m,(BlockEncoder *)&command_enc.bits_);
      if (is_last != 0) {
        JumpToByteBoundary(storage_ix,storage);
      }
      return;
    }
    pCVar7 = commands + num_distance_codes;
    uVar2._0_4_ = pCVar7->insert_len_;
    uVar2._4_4_ = pCVar7->copy_len_;
    cmd.insert_len_ = pCVar7->dist_extra_;
    cmd.copy_len_._0_2_ = pCVar7->cmd_prefix_;
    cmd.copy_len_._2_2_ = pCVar7->dist_prefix_;
    StoreSymbol((BlockEncoder *)&distance_enc.bits_,(ulong)cmd._0_8_ >> 0x20 & 0xffff,storage_ix,
                storage);
    uVar4 = uVar2._4_4_ & 0xffffff ^ (uint)uVar2._4_4_ >> 0x18;
    uVar8 = uVar2 & 0xffffffff;
    if (uVar8 < 6) {
      local_4a = (ushort)(undefined4)uVar2;
    }
    else if (uVar8 < 0x82) {
      iVar6 = 0x1f;
      if ((undefined4)uVar2 - 2 != 0) {
        for (; (undefined4)uVar2 - 2 >> iVar6 == 0; iVar6 = iVar6 + -1) {
        }
      }
      local_4a = (short)(iVar6 + -1) * 2 + (short)(uVar8 - 2 >> ((byte)(iVar6 + -1) & 0x3f)) + 2;
    }
    else if (uVar8 < 0x842) {
      iVar6 = 0x1f;
      if ((undefined4)uVar2 - 0x42 != 0) {
        for (; (undefined4)uVar2 - 0x42 >> iVar6 == 0; iVar6 = iVar6 + -1) {
        }
      }
      local_4a = (short)iVar6 + 10;
    }
    else if (uVar8 < 0x1842) {
      local_4a = 0x15;
    }
    else if (uVar8 < 0x5842) {
      local_4a = 0x16;
    }
    else {
      local_4a = 0x17;
    }
    uVar8 = (ulong)uVar4;
    if (uVar8 < 10) {
      local_22 = (short)uVar4 - 2;
    }
    else if (uVar8 < 0x86) {
      iVar6 = 0x1f;
      if (uVar4 - 6 != 0) {
        for (; uVar4 - 6 >> iVar6 == 0; iVar6 = iVar6 + -1) {
        }
      }
      local_22 = (short)(iVar6 + -1) * 2 + (short)(uVar8 - 6 >> ((byte)(iVar6 + -1) & 0x3f)) + 4;
    }
    else if (uVar8 < 0x846) {
      iVar6 = 0x1f;
      if (uVar4 - 0x46 != 0) {
        for (; uVar4 - 0x46 >> iVar6 == 0; iVar6 = iVar6 + -1) {
        }
      }
      local_22 = (short)iVar6 + 0xc;
    }
    else {
      local_22 = 0x17;
    }
    uVar8 = (ulong)(uVar4 - kCopyBase[local_22]) << ((byte)kInsExtra[local_4a] & 0x3f) |
            (ulong)((undefined4)uVar2 - kInsBase[local_4a]);
    uVar4 = kInsExtra[local_4a] + kCopyExtra[local_22];
    if (uVar8 >> ((byte)uVar4 & 0x3f) != 0) break;
    if (0x38 < (ulong)uVar4) {
      __assert_fail("n_bits <= 56",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/brezza92[P]brotli/enc/././write_bits.h"
                    ,0x37,
                    "void BrotliWriteBits(size_t, uint64_t, size_t *restrict, uint8_t *restrict)");
    }
    *(ulong *)(storage + (*storage_ix >> 3)) =
         uVar8 << ((byte)*storage_ix & 7) | (ulong)(byte)*(ulong *)(storage + (*storage_ix >> 3));
    *storage_ix = (ulong)uVar4 + *storage_ix;
    if (mb->literal_context_map_size == 0) {
      for (j_1 = uVar2 & 0xffffffff; j_1 != 0; j_1 = j_1 - 1) {
        StoreSymbol((BlockEncoder *)&command_enc.bits_,(ulong)input[i & mask],storage_ix,storage);
        i = i + 1;
      }
    }
    else {
      for (context = uVar2 & 0xffffffff; context != 0; context = context - 1) {
        switch(literal_context_mode) {
        case CONTEXT_LSB6:
          local_e1 = pos._7_1_ & 0x3f;
          break;
        case CONTEXT_MSB6:
          local_e1 = (byte)((int)(uint)pos._7_1_ >> 2);
          break;
        case CONTEXT_UTF8:
          local_e1 = ""[pos._7_1_] | ""[(int)(prev_byte2 + 0x100)];
          break;
        case CONTEXT_SIGNED:
          local_e1 = ""[pos._7_1_] * '\b' + ""[prev_byte2];
          break;
        default:
          local_e1 = 0;
        }
        bVar1 = input[i & mask];
        StoreSymbolWithContext
                  ((BlockEncoder *)&command_enc.bits_,(ulong)bVar1,(ulong)local_e1,
                   mb->literal_context_map,storage_ix,storage,6);
        prev_byte2 = pos._7_1_;
        i = i + 1;
        pos._7_1_ = bVar1;
      }
    }
    uVar3 = cmd._0_8_;
    i = (uVar2._4_4_ & 0xffffff) + i;
    if ((uVar2 & 0xffffff00000000) != 0) {
      prev_byte2 = input[i - 2 & mask];
      pos._7_1_ = input[i - 1 & mask];
      if (0x7f < (ushort)cmd.copy_len_) {
        uVar4 = cmd.insert_len_ >> 0x18;
        uVar5 = cmd.insert_len_ & 0xffffff;
        if (mb->distance_context_map_size == 0) {
          StoreSymbol((BlockEncoder *)&cmd.dist_extra_,(ulong)cmd._0_8_ >> 0x30,storage_ix,storage);
        }
        else {
          iVar6 = (int)(uint)(ushort)cmd.copy_len_ >> 6;
          local_bc = (ushort)cmd.copy_len_ & 7;
          if (((((iVar6 != 0) && (iVar6 != 2)) && (iVar6 != 4)) && (iVar6 != 7)) || (2 < local_bc))
          {
            local_bc = 3;
          }
          StoreSymbolWithContext
                    ((BlockEncoder *)&cmd.dist_extra_,(ulong)cmd._0_8_ >> 0x30,(ulong)local_bc,
                     mb->distance_context_map,storage_ix,storage,2);
        }
        if (uVar5 >> (SUB81(uVar3,3) & 0x3f) != 0) {
          __assert_fail("(bits >> n_bits) == 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/brezza92[P]brotli/enc/././write_bits.h"
                        ,0x36,
                        "void BrotliWriteBits(size_t, uint64_t, size_t *restrict, uint8_t *restrict)"
                       );
        }
        if (0x38 < (ulong)uVar4) {
          __assert_fail("n_bits <= 56",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/brezza92[P]brotli/enc/././write_bits.h"
                        ,0x37,
                        "void BrotliWriteBits(size_t, uint64_t, size_t *restrict, uint8_t *restrict)"
                       );
        }
        *(ulong *)(storage + (*storage_ix >> 3)) =
             (ulong)uVar5 << ((byte)*storage_ix & 7) |
             (ulong)(byte)*(ulong *)(storage + (*storage_ix >> 3));
        *storage_ix = (ulong)uVar4 + *storage_ix;
      }
    }
    num_distance_codes = num_distance_codes + 1;
  }
  __assert_fail("(bits >> n_bits) == 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/brezza92[P]brotli/enc/././write_bits.h"
                ,0x36,"void BrotliWriteBits(size_t, uint64_t, size_t *restrict, uint8_t *restrict)")
  ;
}

Assistant:

void BrotliStoreMetaBlock(MemoryManager* m,
                          const uint8_t* input,
                          size_t start_pos,
                          size_t length,
                          size_t mask,
                          uint8_t prev_byte,
                          uint8_t prev_byte2,
                          BROTLI_BOOL is_last,
                          uint32_t num_direct_distance_codes,
                          uint32_t distance_postfix_bits,
                          ContextType literal_context_mode,
                          const Command *commands,
                          size_t n_commands,
                          const MetaBlockSplit* mb,
                          size_t *storage_ix,
                          uint8_t *storage) {
  size_t pos = start_pos;
  size_t i;
  size_t num_distance_codes =
      BROTLI_NUM_DISTANCE_SHORT_CODES + num_direct_distance_codes +
      (48u << distance_postfix_bits);
  HuffmanTree* tree;
  BlockEncoder literal_enc;
  BlockEncoder command_enc;
  BlockEncoder distance_enc;

  StoreCompressedMetaBlockHeader(is_last, length, storage_ix, storage);

  tree = BROTLI_ALLOC(m, HuffmanTree, MAX_HUFFMAN_TREE_SIZE);
  if (BROTLI_IS_OOM(m)) return;
  InitBlockEncoder(&literal_enc, 256, mb->literal_split.num_types,
      mb->literal_split.types, mb->literal_split.lengths,
      mb->literal_split.num_blocks);
  InitBlockEncoder(&command_enc, BROTLI_NUM_COMMAND_SYMBOLS,
      mb->command_split.num_types, mb->command_split.types,
      mb->command_split.lengths, mb->command_split.num_blocks);
  InitBlockEncoder(&distance_enc, num_distance_codes,
      mb->distance_split.num_types, mb->distance_split.types,
      mb->distance_split.lengths, mb->distance_split.num_blocks);

  BuildAndStoreBlockSwitchEntropyCodes(&literal_enc, tree, storage_ix, storage);
  BuildAndStoreBlockSwitchEntropyCodes(&command_enc, tree, storage_ix, storage);
  BuildAndStoreBlockSwitchEntropyCodes(
      &distance_enc, tree, storage_ix, storage);

  BrotliWriteBits(2, distance_postfix_bits, storage_ix, storage);
  BrotliWriteBits(4, num_direct_distance_codes >> distance_postfix_bits,
                  storage_ix, storage);
  for (i = 0; i < mb->literal_split.num_types; ++i) {
    BrotliWriteBits(2, literal_context_mode, storage_ix, storage);
  }

  if (mb->literal_context_map_size == 0) {
    StoreTrivialContextMap(mb->literal_histograms_size,
        BROTLI_LITERAL_CONTEXT_BITS, tree, storage_ix, storage);
  } else {
    EncodeContextMap(m,
        mb->literal_context_map, mb->literal_context_map_size,
        mb->literal_histograms_size, tree, storage_ix, storage);
    if (BROTLI_IS_OOM(m)) return;
  }

  if (mb->distance_context_map_size == 0) {
    StoreTrivialContextMap(mb->distance_histograms_size,
        BROTLI_DISTANCE_CONTEXT_BITS, tree, storage_ix, storage);
  } else {
    EncodeContextMap(m,
        mb->distance_context_map, mb->distance_context_map_size,
        mb->distance_histograms_size, tree, storage_ix, storage);
    if (BROTLI_IS_OOM(m)) return;
  }

  BuildAndStoreEntropyCodesLiteral(m, &literal_enc, mb->literal_histograms,
      mb->literal_histograms_size, tree, storage_ix, storage);
  if (BROTLI_IS_OOM(m)) return;
  BuildAndStoreEntropyCodesCommand(m, &command_enc, mb->command_histograms,
      mb->command_histograms_size, tree, storage_ix, storage);
  if (BROTLI_IS_OOM(m)) return;
  BuildAndStoreEntropyCodesDistance(m, &distance_enc, mb->distance_histograms,
      mb->distance_histograms_size, tree, storage_ix, storage);
  if (BROTLI_IS_OOM(m)) return;
  BROTLI_FREE(m, tree);

  for (i = 0; i < n_commands; ++i) {
    const Command cmd = commands[i];
    size_t cmd_code = cmd.cmd_prefix_;
    StoreSymbol(&command_enc, cmd_code, storage_ix, storage);
    StoreCommandExtra(&cmd, storage_ix, storage);
    if (mb->literal_context_map_size == 0) {
      size_t j;
      for (j = cmd.insert_len_; j != 0; --j) {
        StoreSymbol(&literal_enc, input[pos & mask], storage_ix, storage);
        ++pos;
      }
    } else {
      size_t j;
      for (j = cmd.insert_len_; j != 0; --j) {
        size_t context = Context(prev_byte, prev_byte2, literal_context_mode);
        uint8_t literal = input[pos & mask];
        StoreSymbolWithContext(&literal_enc, literal, context,
            mb->literal_context_map, storage_ix, storage,
            BROTLI_LITERAL_CONTEXT_BITS);
        prev_byte2 = prev_byte;
        prev_byte = literal;
        ++pos;
      }
    }
    pos += CommandCopyLen(&cmd);
    if (CommandCopyLen(&cmd)) {
      prev_byte2 = input[(pos - 2) & mask];
      prev_byte = input[(pos - 1) & mask];
      if (cmd.cmd_prefix_ >= 128) {
        size_t dist_code = cmd.dist_prefix_;
        uint32_t distnumextra = cmd.dist_extra_ >> 24;
        uint64_t distextra = cmd.dist_extra_ & 0xffffff;
        if (mb->distance_context_map_size == 0) {
          StoreSymbol(&distance_enc, dist_code, storage_ix, storage);
        } else {
          size_t context = CommandDistanceContext(&cmd);
          StoreSymbolWithContext(&distance_enc, dist_code, context,
              mb->distance_context_map, storage_ix, storage,
              BROTLI_DISTANCE_CONTEXT_BITS);
        }
        BrotliWriteBits(distnumextra, distextra, storage_ix, storage);
      }
    }
  }
  CleanupBlockEncoder(m, &distance_enc);
  CleanupBlockEncoder(m, &command_enc);
  CleanupBlockEncoder(m, &literal_enc);
  if (is_last) {
    JumpToByteBoundary(storage_ix, storage);
  }
}